

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

void __thiscall asmjit::ConstPool::ConstPool(ConstPool *this,Zone *zone)

{
  Zone *in_RDI;
  uint8_t **local_28;
  
  local_28 = &in_RDI->_end;
  do {
    *local_28 = (uint8_t *)0x0;
    local_28[1] = (uint8_t *)0x0;
    local_28[2] = (uint8_t *)0x0;
    local_28 = local_28 + 3;
  } while (local_28 != (uint8_t **)&in_RDI[4]._blockSize);
  reset((ConstPool *)0x0,in_RDI);
  return;
}

Assistant:

ConstPool::ConstPool(Zone* zone) noexcept { reset(zone); }